

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.h
# Opt level: O1

Vector3f __thiscall pbrt::BSDF::LocalToRender(BSDF *this,Vector3f *v)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  Vector3f VVar10;
  
  uVar5._0_4_ = (v->super_Tuple3<pbrt::Vector3,_float>).x;
  uVar5._4_4_ = (v->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar5;
  auVar9 = vmovshdup_avx(auVar9);
  fVar1 = (v->super_Tuple3<pbrt::Vector3,_float>).z;
  uVar2 = (this->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.x;
  uVar6 = (this->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.y;
  uVar3 = (this->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.x;
  uVar7 = (this->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.y;
  uVar4 = (this->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.x;
  uVar8 = (this->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.y;
  VVar10.super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(undefined4)uVar5 * (float)uVar2 + auVar9._0_4_ * (float)uVar3 + fVar1 * (float)uVar4;
  VVar10.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(undefined4)uVar5 * (float)uVar6 + auVar9._4_4_ * (float)uVar7 + fVar1 * (float)uVar8;
  VVar10.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)(undefined4)uVar5 * (this->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.z +
       auVar9._0_4_ * (this->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.z +
       fVar1 * (this->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.z;
  return (Vector3f)VVar10.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

PBRT_CPU_GPU
    Vector3f LocalToRender(const Vector3f &v) const { return shadingFrame.FromLocal(v); }